

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O2

void __thiscall
tchecker::clock_update_t::clock_update_t
          (clock_update_t *this,clock_id_t clock_id,shared_ptr<const_tchecker::expression_t> *value)

{
  invalid_argument *this_00;
  
  this->_clock_id = clock_id;
  std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_value).
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &value->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Unexpected nullptr value");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

clock_update_t::clock_update_t(tchecker::clock_id_t clock_id, std::shared_ptr<tchecker::expression_t const> const & value)
    : _clock_id(clock_id), _value(value)
{
  if (_value == nullptr)
    throw std::invalid_argument("Unexpected nullptr value");
}